

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ptexture.h
# Opt level: O3

void Ptex::v2_2::(anonymous_namespace)::Apply<unsigned_char,2>
               (PtexSeparableKernel *k,float *result,void *data,int param_4,int param_5)

{
  float fVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  float *pfVar5;
  long lVar6;
  ushort *puVar7;
  ushort *puVar8;
  float *pfVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  
  bVar2 = (k->res).ulog2;
  iVar10 = 2 << (bVar2 & 0x1f);
  lVar6 = (long)iVar10 * (long)k->vw;
  if ((int)lVar6 != 0) {
    puVar8 = (ushort *)((long)data + ((long)(k->v << (bVar2 & 0x1f)) + (long)k->u) * 2);
    puVar7 = (ushort *)(lVar6 + (long)puVar8);
    pfVar9 = k->kv;
    iVar4 = k->uw;
    pfVar5 = k->ku;
    do {
      fVar12 = *pfVar5;
      fVar11 = fVar12 * (float)(*puVar8 & 0xff);
      fVar12 = fVar12 * (float)(byte)(*puVar8 >> 8);
      if (iVar4 != 1) {
        lVar6 = 0;
        do {
          uVar3 = *(ushort *)((long)puVar8 + lVar6 + 2);
          fVar1 = *(float *)((long)pfVar5 + lVar6 * 2 + 4);
          fVar11 = fVar11 + fVar1 * (float)(uVar3 & 0xff);
          fVar12 = fVar12 + fVar1 * (float)(byte)(uVar3 >> 8);
          lVar6 = lVar6 + 2;
        } while ((long)(iVar4 * 2) + -2 != lVar6);
        puVar8 = (ushort *)((long)puVar8 + lVar6);
      }
      fVar1 = *pfVar9;
      pfVar9 = pfVar9 + 1;
      *(ulong *)result =
           CONCAT44(fVar1 * fVar12 + (float)((ulong)*(undefined8 *)result >> 0x20),
                    fVar1 * fVar11 + (float)*(undefined8 *)result);
      puVar8 = (ushort *)((long)puVar8 + (long)(iVar10 + iVar4 * -2) + 2);
    } while (puVar8 != puVar7);
  }
  return;
}

Assistant:

int u() const { return 1<<(unsigned)ulog2; }